

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.h
# Opt level: O1

Sets * __thiscall wasm::LazyLocalGraph::getSets(LazyLocalGraph *this,LocalGet *get)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  __hash_code __code;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  
  uVar1 = (this->getSetsMap)._M_h._M_bucket_count;
  uVar3 = (ulong)get % uVar1;
  p_Var4 = (this->getSetsMap)._M_h._M_buckets[uVar3];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var4->_M_nxt, p_Var5 = p_Var4, (LocalGet *)p_Var4->_M_nxt[1]._M_nxt != get)) {
    while (p_Var4 = p_Var2, p_Var2 = p_Var4->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar3) ||
         (p_Var5 = p_Var4, (LocalGet *)p_Var2[1]._M_nxt == get)) goto LAB_0071c0f9;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_0071c0f9:
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var5->_M_nxt;
  }
  if (p_Var2 == (_Hash_node_base *)0x0) {
    computeGetSets(this,get);
    uVar1 = (this->getSetsMap)._M_h._M_bucket_count;
    uVar3 = (ulong)get % uVar1;
    p_Var4 = (this->getSetsMap)._M_h._M_buckets[uVar3];
    p_Var5 = (__node_base_ptr)0x0;
    if ((p_Var4 != (__node_base_ptr)0x0) &&
       (p_Var2 = p_Var4->_M_nxt, p_Var5 = p_Var4, (LocalGet *)p_Var4->_M_nxt[1]._M_nxt != get)) {
      while (p_Var4 = p_Var2, p_Var2 = p_Var4->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
        p_Var5 = (__node_base_ptr)0x0;
        if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar3) ||
           (p_Var5 = p_Var4, (LocalGet *)p_Var2[1]._M_nxt == get)) goto LAB_0071c16f;
      }
      p_Var5 = (__node_base_ptr)0x0;
    }
LAB_0071c16f:
    if (p_Var5 == (__node_base_ptr)0x0) {
      p_Var2 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var2 = p_Var5->_M_nxt;
    }
    if (p_Var2 == (_Hash_node_base *)0x0) {
      __assert_fail("iter != getSetsMap.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/local-graph.h"
                    ,0xc4,"const Sets &wasm::LazyLocalGraph::getSets(LocalGet *) const");
    }
  }
  return (Sets *)(p_Var2 + 2);
}

Assistant:

const Sets& getSets(LocalGet* get) const {
    auto iter = getSetsMap.find(get);
    if (iter == getSetsMap.end()) {
      computeGetSets(get);
      iter = getSetsMap.find(get);
      assert(iter != getSetsMap.end());
    }
    return iter->second;
  }